

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O3

void Aig_RManRecord(uint *pTruth,int nVarsInit)

{
  uint *__src;
  Kit_DsdObj_t KVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Aig_RMan_t *pAVar26;
  uint uVar27;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar28;
  char cVar29;
  ulong uVar30;
  uint nVars;
  void *__src_00;
  char *__s;
  uint iVar;
  ulong uVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar44;
  int iVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  long lVar45;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar67;
  undefined1 auVar65 [16];
  int iVar68;
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  int iVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar31;
  long lVar48;
  
  if (0xc < nVarsInit) {
    __s = "The number of variables in too large.";
LAB_006b6699:
    puts(__s);
    return;
  }
  if (s_pRMan == (Aig_RMan_t *)0x0) {
    s_pRMan = Aig_RManStart();
  }
  s_pRMan->nTotal = s_pRMan->nTotal + 1;
  pNtk = Kit_DsdDecompose(pTruth,nVarsInit);
  pKVar28 = Kit_DsdNonDsdPrimeMax(pNtk);
  pAVar26 = s_pRMan;
  if (pKVar28 != (Kit_DsdObj_t *)0x0) {
    KVar1 = *pKVar28;
    nVars = (uint)KVar1 >> 0x1a;
    uVar31 = (ulong)nVars;
    if (nVars != 3) {
      s_pRMan->nVarFuncs[uVar31] = s_pRMan->nVarFuncs[uVar31] + 1;
      if ((int)nVars < nVarsInit) {
        pAVar26->nTtDsdPart = pAVar26->nTtDsdPart + 1;
      }
      else {
        pAVar26->nTtDsdNot = pAVar26->nTtDsdNot + 1;
      }
      uVar27 = 1 << ((KVar1._3_1_ >> 2) - 5 & 0x1f);
      if ((uint)KVar1 < 0x18000000) {
        uVar27 = 1;
      }
      uVar32 = (ulong)uVar27;
      __src_00 = (void *)0x0;
      if (((uint)*pKVar28 & 0x1c0) == 0x140) {
        __src_00 = &pKVar28[1].field_0x0 + ((uint)*pKVar28 >> 8 & 0x3fc);
      }
      memcpy(pAVar26->pTruthInit,__src_00,(long)(int)(uVar27 * 4));
      Kit_DsdNtkFree(pNtk);
      pAVar26 = s_pRMan;
      __src = s_pRMan->pTruthInit;
      if (((s_pRMan->pTruthInit[0] & 1) != 0) && (uVar30 = uVar32, 0 < (int)uVar27)) {
        do {
          pAVar26->pTruthInit[uVar30 - 1] = ~pAVar26->pTruthInit[uVar30 - 1];
          bVar2 = 1 < uVar30;
          uVar30 = uVar30 - 1;
        } while (bVar2);
      }
      memcpy(pAVar26->pTruth,__src,(long)(int)(uVar27 * 4));
      auVar25 = _DAT_0093d220;
      if (0x3ffffff < (uint)KVar1) {
        lVar33 = uVar31 - 1;
        auVar34._8_4_ = (int)lVar33;
        auVar34._0_8_ = lVar33;
        auVar34._12_4_ = (int)((ulong)lVar33 >> 0x20);
        uVar30 = 0;
        auVar35 = auVar34;
        auVar47 = _DAT_009b63a0;
        auVar49 = _DAT_009b63b0;
        auVar50 = _DAT_009b63c0;
        auVar51 = _DAT_009b63d0;
        auVar52 = _DAT_009b63e0;
        auVar53 = _DAT_009b63f0;
        auVar54 = _DAT_0093e4e0;
        auVar55 = _DAT_0093d210;
        do {
          auVar65 = auVar34 ^ auVar25;
          auVar69 = auVar55 ^ auVar25;
          iVar44 = auVar65._0_4_;
          iVar82 = -(uint)(iVar44 < auVar69._0_4_);
          iVar46 = auVar65._4_4_;
          auVar71._4_4_ = -(uint)(iVar46 < auVar69._4_4_);
          iVar67 = auVar65._8_4_;
          iVar86 = -(uint)(iVar67 < auVar69._8_4_);
          iVar68 = auVar65._12_4_;
          auVar71._12_4_ = -(uint)(iVar68 < auVar69._12_4_);
          auVar65._4_4_ = iVar82;
          auVar65._0_4_ = iVar82;
          auVar65._8_4_ = iVar86;
          auVar65._12_4_ = iVar86;
          auVar65 = pshuflw(auVar35,auVar65,0xe8);
          auVar70._4_4_ = -(uint)(auVar69._4_4_ == iVar46);
          auVar70._12_4_ = -(uint)(auVar69._12_4_ == iVar68);
          auVar70._0_4_ = auVar70._4_4_;
          auVar70._8_4_ = auVar70._12_4_;
          auVar56 = pshuflw(in_XMM11,auVar70,0xe8);
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar69 = pshuflw(auVar65,auVar71,0xe8);
          auVar35._8_4_ = 0xffffffff;
          auVar35._0_8_ = 0xffffffffffffffff;
          auVar35._12_4_ = 0xffffffff;
          auVar35 = (auVar69 | auVar56 & auVar65) ^ auVar35;
          auVar35 = packssdw(auVar35,auVar35);
          cVar29 = (char)uVar30;
          if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pAVar26->pPerm[uVar30] = cVar29;
          }
          auVar56._4_4_ = iVar82;
          auVar56._0_4_ = iVar82;
          auVar56._8_4_ = iVar86;
          auVar56._12_4_ = iVar86;
          auVar71 = auVar70 & auVar56 | auVar71;
          auVar35 = packssdw(auVar71,auVar71);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar69,auVar35 ^ auVar69);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._0_4_ >> 8 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 1] = cVar29 + '\x01';
          }
          auVar35 = auVar54 ^ auVar25;
          auVar57._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar57._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar57._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar57._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar72._4_4_ = auVar57._0_4_;
          auVar72._0_4_ = auVar57._0_4_;
          auVar72._8_4_ = auVar57._8_4_;
          auVar72._12_4_ = auVar57._8_4_;
          iVar82 = -(uint)(auVar35._4_4_ == iVar46);
          iVar86 = -(uint)(auVar35._12_4_ == iVar68);
          auVar12._4_4_ = iVar82;
          auVar12._0_4_ = iVar82;
          auVar12._8_4_ = iVar86;
          auVar12._12_4_ = iVar86;
          auVar83._4_4_ = auVar57._4_4_;
          auVar83._0_4_ = auVar57._4_4_;
          auVar83._8_4_ = auVar57._12_4_;
          auVar83._12_4_ = auVar57._12_4_;
          auVar35 = auVar12 & auVar72 | auVar83;
          auVar35 = packssdw(auVar35,auVar35);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar3,auVar35 ^ auVar3);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 2] = cVar29 + '\x02';
          }
          auVar35 = pshufhw(auVar35,auVar72,0x84);
          auVar13._4_4_ = iVar82;
          auVar13._0_4_ = iVar82;
          auVar13._8_4_ = iVar86;
          auVar13._12_4_ = iVar86;
          auVar69 = pshufhw(auVar57,auVar13,0x84);
          auVar65 = pshufhw(auVar35,auVar83,0x84);
          auVar36._8_4_ = 0xffffffff;
          auVar36._0_8_ = 0xffffffffffffffff;
          auVar36._12_4_ = 0xffffffff;
          auVar36 = (auVar65 | auVar69 & auVar35) ^ auVar36;
          auVar35 = packssdw(auVar36,auVar36);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._0_4_ >> 0x18 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 3] = cVar29 + '\x03';
          }
          auVar35 = auVar53 ^ auVar25;
          auVar58._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar58._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar58._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar58._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar14._4_4_ = auVar58._0_4_;
          auVar14._0_4_ = auVar58._0_4_;
          auVar14._8_4_ = auVar58._8_4_;
          auVar14._12_4_ = auVar58._8_4_;
          auVar69 = pshuflw(auVar83,auVar14,0xe8);
          auVar37._0_4_ = -(uint)(auVar35._0_4_ == iVar44);
          auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar46);
          auVar37._8_4_ = -(uint)(auVar35._8_4_ == iVar67);
          auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar68);
          auVar73._4_4_ = auVar37._4_4_;
          auVar73._0_4_ = auVar37._4_4_;
          auVar73._8_4_ = auVar37._12_4_;
          auVar73._12_4_ = auVar37._12_4_;
          auVar35 = pshuflw(auVar37,auVar73,0xe8);
          auVar74._4_4_ = auVar58._4_4_;
          auVar74._0_4_ = auVar58._4_4_;
          auVar74._8_4_ = auVar58._12_4_;
          auVar74._12_4_ = auVar58._12_4_;
          auVar65 = pshuflw(auVar58,auVar74,0xe8);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 & auVar69,(auVar65 | auVar35 & auVar69) ^ auVar4);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pAVar26->pPerm[uVar30 + 4] = cVar29 + '\x04';
          }
          auVar15._4_4_ = auVar58._0_4_;
          auVar15._0_4_ = auVar58._0_4_;
          auVar15._8_4_ = auVar58._8_4_;
          auVar15._12_4_ = auVar58._8_4_;
          auVar74 = auVar73 & auVar15 | auVar74;
          auVar65 = packssdw(auVar74,auVar74);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35,auVar65 ^ auVar5);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._4_2_ >> 8 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 5] = cVar29 + '\x05';
          }
          auVar35 = auVar52 ^ auVar25;
          auVar59._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar59._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar59._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar59._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar75._4_4_ = auVar59._0_4_;
          auVar75._0_4_ = auVar59._0_4_;
          auVar75._8_4_ = auVar59._8_4_;
          auVar75._12_4_ = auVar59._8_4_;
          iVar82 = -(uint)(auVar35._4_4_ == iVar46);
          iVar86 = -(uint)(auVar35._12_4_ == iVar68);
          auVar16._4_4_ = iVar82;
          auVar16._0_4_ = iVar82;
          auVar16._8_4_ = iVar86;
          auVar16._12_4_ = iVar86;
          auVar84._4_4_ = auVar59._4_4_;
          auVar84._0_4_ = auVar59._4_4_;
          auVar84._8_4_ = auVar59._12_4_;
          auVar84._12_4_ = auVar59._12_4_;
          auVar35 = auVar16 & auVar75 | auVar84;
          auVar35 = packssdw(auVar35,auVar35);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar6,auVar35 ^ auVar6);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pAVar26->pPerm[uVar30 + 6] = cVar29 + '\x06';
          }
          auVar35 = pshufhw(auVar35,auVar75,0x84);
          auVar17._4_4_ = iVar82;
          auVar17._0_4_ = iVar82;
          auVar17._8_4_ = iVar86;
          auVar17._12_4_ = iVar86;
          auVar69 = pshufhw(auVar59,auVar17,0x84);
          auVar65 = pshufhw(auVar35,auVar84,0x84);
          auVar38._8_4_ = 0xffffffff;
          auVar38._0_8_ = 0xffffffffffffffff;
          auVar38._12_4_ = 0xffffffff;
          auVar38 = (auVar65 | auVar69 & auVar35) ^ auVar38;
          auVar35 = packssdw(auVar38,auVar38);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._6_2_ >> 8 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 7] = cVar29 + '\a';
          }
          auVar35 = auVar51 ^ auVar25;
          auVar60._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar60._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar60._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar60._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar18._4_4_ = auVar60._0_4_;
          auVar18._0_4_ = auVar60._0_4_;
          auVar18._8_4_ = auVar60._8_4_;
          auVar18._12_4_ = auVar60._8_4_;
          auVar69 = pshuflw(auVar84,auVar18,0xe8);
          auVar39._0_4_ = -(uint)(auVar35._0_4_ == iVar44);
          auVar39._4_4_ = -(uint)(auVar35._4_4_ == iVar46);
          auVar39._8_4_ = -(uint)(auVar35._8_4_ == iVar67);
          auVar39._12_4_ = -(uint)(auVar35._12_4_ == iVar68);
          auVar76._4_4_ = auVar39._4_4_;
          auVar76._0_4_ = auVar39._4_4_;
          auVar76._8_4_ = auVar39._12_4_;
          auVar76._12_4_ = auVar39._12_4_;
          auVar35 = pshuflw(auVar39,auVar76,0xe8);
          auVar77._4_4_ = auVar60._4_4_;
          auVar77._0_4_ = auVar60._4_4_;
          auVar77._8_4_ = auVar60._12_4_;
          auVar77._12_4_ = auVar60._12_4_;
          auVar65 = pshuflw(auVar60,auVar77,0xe8);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar65 | auVar35 & auVar69) ^ auVar61;
          auVar65 = packssdw(auVar61,auVar61);
          auVar35 = packsswb(auVar35 & auVar69,auVar65);
          if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pAVar26->pPerm[uVar30 + 8] = cVar29 + '\b';
          }
          auVar19._4_4_ = auVar60._0_4_;
          auVar19._0_4_ = auVar60._0_4_;
          auVar19._8_4_ = auVar60._8_4_;
          auVar19._12_4_ = auVar60._8_4_;
          auVar77 = auVar76 & auVar19 | auVar77;
          auVar65 = packssdw(auVar77,auVar77);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar65 = packssdw(auVar65 ^ auVar7,auVar65 ^ auVar7);
          auVar35 = packsswb(auVar35,auVar65);
          if ((auVar35._8_2_ >> 8 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 9] = cVar29 + '\t';
          }
          auVar35 = auVar50 ^ auVar25;
          auVar62._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar62._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar62._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar62._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar78._4_4_ = auVar62._0_4_;
          auVar78._0_4_ = auVar62._0_4_;
          auVar78._8_4_ = auVar62._8_4_;
          auVar78._12_4_ = auVar62._8_4_;
          iVar82 = -(uint)(auVar35._4_4_ == iVar46);
          iVar86 = -(uint)(auVar35._12_4_ == iVar68);
          auVar20._4_4_ = iVar82;
          auVar20._0_4_ = iVar82;
          auVar20._8_4_ = iVar86;
          auVar20._12_4_ = iVar86;
          auVar85._4_4_ = auVar62._4_4_;
          auVar85._0_4_ = auVar62._4_4_;
          auVar85._8_4_ = auVar62._12_4_;
          auVar85._12_4_ = auVar62._12_4_;
          auVar35 = auVar20 & auVar78 | auVar85;
          auVar35 = packssdw(auVar35,auVar35);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar8,auVar35 ^ auVar8);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pAVar26->pPerm[uVar30 + 10] = cVar29 + '\n';
          }
          auVar35 = pshufhw(auVar35,auVar78,0x84);
          auVar21._4_4_ = iVar82;
          auVar21._0_4_ = iVar82;
          auVar21._8_4_ = iVar86;
          auVar21._12_4_ = iVar86;
          auVar69 = pshufhw(auVar62,auVar21,0x84);
          auVar65 = pshufhw(auVar35,auVar85,0x84);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar65 | auVar69 & auVar35) ^ auVar40;
          auVar35 = packssdw(auVar40,auVar40);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._10_2_ >> 8 & 1) != 0) {
            pAVar26->pPerm[uVar30 + 0xb] = cVar29 + '\v';
          }
          auVar35 = auVar49 ^ auVar25;
          auVar63._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar63._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar63._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar63._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar22._4_4_ = auVar63._0_4_;
          auVar22._0_4_ = auVar63._0_4_;
          auVar22._8_4_ = auVar63._8_4_;
          auVar22._12_4_ = auVar63._8_4_;
          auVar69 = pshuflw(auVar85,auVar22,0xe8);
          auVar41._0_4_ = -(uint)(auVar35._0_4_ == iVar44);
          auVar41._4_4_ = -(uint)(auVar35._4_4_ == iVar46);
          auVar41._8_4_ = -(uint)(auVar35._8_4_ == iVar67);
          auVar41._12_4_ = -(uint)(auVar35._12_4_ == iVar68);
          auVar79._4_4_ = auVar41._4_4_;
          auVar79._0_4_ = auVar41._4_4_;
          auVar79._8_4_ = auVar41._12_4_;
          auVar79._12_4_ = auVar41._12_4_;
          auVar35 = pshuflw(auVar41,auVar79,0xe8);
          auVar80._4_4_ = auVar63._4_4_;
          auVar80._0_4_ = auVar63._4_4_;
          auVar80._8_4_ = auVar63._12_4_;
          auVar80._12_4_ = auVar63._12_4_;
          auVar65 = pshuflw(auVar63,auVar80,0xe8);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 & auVar69,(auVar65 | auVar35 & auVar69) ^ auVar9);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pAVar26->pPermR[uVar30] = cVar29 + '\f';
          }
          auVar23._4_4_ = auVar63._0_4_;
          auVar23._0_4_ = auVar63._0_4_;
          auVar23._8_4_ = auVar63._8_4_;
          auVar23._12_4_ = auVar63._8_4_;
          auVar80 = auVar79 & auVar23 | auVar80;
          auVar65 = packssdw(auVar80,auVar80);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35,auVar65 ^ auVar10);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._12_2_ >> 8 & 1) != 0) {
            pAVar26->pPermR[uVar30 + 1] = cVar29 + '\r';
          }
          auVar35 = auVar47 ^ auVar25;
          auVar64._0_4_ = -(uint)(iVar44 < auVar35._0_4_);
          auVar64._4_4_ = -(uint)(iVar46 < auVar35._4_4_);
          auVar64._8_4_ = -(uint)(iVar67 < auVar35._8_4_);
          auVar64._12_4_ = -(uint)(iVar68 < auVar35._12_4_);
          auVar81._4_4_ = auVar64._0_4_;
          auVar81._0_4_ = auVar64._0_4_;
          auVar81._8_4_ = auVar64._8_4_;
          auVar81._12_4_ = auVar64._8_4_;
          iVar44 = -(uint)(auVar35._4_4_ == iVar46);
          iVar46 = -(uint)(auVar35._12_4_ == iVar68);
          auVar66._4_4_ = iVar44;
          auVar66._0_4_ = iVar44;
          auVar66._8_4_ = iVar46;
          auVar66._12_4_ = iVar46;
          auVar42._4_4_ = auVar64._4_4_;
          auVar42._0_4_ = auVar64._4_4_;
          auVar42._8_4_ = auVar64._12_4_;
          auVar42._12_4_ = auVar64._12_4_;
          auVar42 = auVar66 & auVar81 | auVar42;
          auVar35 = packssdw(auVar42,auVar42);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar11,auVar35 ^ auVar11);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pAVar26->pPermR[uVar30 + 2] = cVar29 + '\x0e';
          }
          auVar35 = pshufhw(auVar35,auVar81,0x84);
          in_XMM11 = pshufhw(auVar64,auVar66,0x84);
          in_XMM11 = in_XMM11 & auVar35;
          auVar24._4_4_ = auVar64._4_4_;
          auVar24._0_4_ = auVar64._4_4_;
          auVar24._8_4_ = auVar64._12_4_;
          auVar24._12_4_ = auVar64._12_4_;
          auVar35 = pshufhw(auVar35,auVar24,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar35 | in_XMM11) ^ auVar43;
          auVar35 = packssdw(auVar43,auVar43);
          auVar35 = packsswb(auVar35,auVar35);
          if ((auVar35._14_2_ >> 8 & 1) != 0) {
            pAVar26->pPermR[uVar30 + 3] = cVar29 + '\x0f';
          }
          uVar30 = uVar30 + 0x10;
          lVar33 = (long)DAT_009b6400;
          lVar48 = auVar55._8_8_;
          auVar55._0_8_ = auVar55._0_8_ + lVar33;
          lVar45 = DAT_009b6400._8_8_;
          auVar55._8_8_ = lVar48 + lVar45;
          lVar48 = auVar54._8_8_;
          auVar54._0_8_ = auVar54._0_8_ + lVar33;
          auVar54._8_8_ = lVar48 + lVar45;
          lVar48 = auVar53._8_8_;
          auVar53._0_8_ = auVar53._0_8_ + lVar33;
          auVar53._8_8_ = lVar48 + lVar45;
          lVar48 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + lVar33;
          auVar52._8_8_ = lVar48 + lVar45;
          lVar48 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + lVar33;
          auVar51._8_8_ = lVar48 + lVar45;
          lVar48 = auVar50._8_8_;
          auVar50._0_8_ = auVar50._0_8_ + lVar33;
          auVar50._8_8_ = lVar48 + lVar45;
          lVar48 = auVar49._8_8_;
          auVar49._0_8_ = auVar49._0_8_ + lVar33;
          auVar49._8_8_ = lVar48 + lVar45;
          lVar48 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + lVar33;
          auVar47._8_8_ = lVar48 + lVar45;
          auVar35 = _DAT_009b6400;
        } while ((nVars + 0xf & 0xfffffff0) != uVar30);
      }
      uVar27 = Aig_RManSemiCanonicize
                         (pAVar26->pTruthTemp,pAVar26->pTruth,nVars,pAVar26->pPerm,pAVar26->pMints,1
                         );
      pAVar26 = s_pRMan;
      iVar44 = Aig_RManVarsAreUnique(s_pRMan->pMints,nVars);
      pAVar26->nUniqueVars = pAVar26->nUniqueVars + iVar44;
      iVar46 = Aig_RManTableFindOrAdd(pAVar26,pAVar26->pTruth,nVars);
      if (iVar46 != 0) {
        Aig_RManSaveOne(s_pRMan,s_pRMan->pTruth,nVars);
      }
      pAVar26 = s_pRMan;
      if ((uint)KVar1 < 0x4000000) {
        Kit_TruthPermute(s_pRMan->pTruthTemp,s_pRMan->pTruth,nVars,s_pRMan->pPermR,1);
      }
      else {
        uVar30 = 0;
        do {
          pAVar26->pPermR[uVar30] = pAVar26->pPerm[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar31 != uVar30);
        Kit_TruthPermute(pAVar26->pTruthTemp,pAVar26->pTruth,nVars,pAVar26->pPermR,1);
        if (0x3ffffff < (uint)KVar1) {
          iVar = 0;
          do {
            if ((uVar27 >> (iVar & 0x1f) & 1) != 0) {
              Kit_TruthChangePhase(s_pRMan->pTruth,nVars,iVar);
            }
            iVar = iVar + 1;
          } while (nVars != iVar);
        }
      }
      if (iVar44 == 0) {
        return;
      }
      do {
        if ((int)uVar32 < 1) {
          return;
        }
        lVar33 = uVar32 - 1;
        lVar45 = uVar32 - 1;
        uVar32 = uVar32 - 1;
      } while (s_pRMan->pTruth[lVar33] == s_pRMan->pTruthInit[lVar45]);
      __s = "Verification failed.";
      goto LAB_006b6699;
    }
  }
  s_pRMan->nTtDsd = s_pRMan->nTtDsd + 1;
  Kit_DsdNtkFree(pNtk);
  return;
}

Assistant:

void Aig_RManRecord( unsigned * pTruth, int nVarsInit )
{
    int fVerify = 1;
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uPhaseC;
    int i, nVars, nWords;
    int fUniqueVars;

    if ( nVarsInit > RMAN_MAXVARS )
    {
        printf( "The number of variables in too large.\n" );
        return;
    }

    if ( s_pRMan == NULL )
        s_pRMan = Aig_RManStart();
    s_pRMan->nTotal++;
    // canonicize the function
    pNtk = Kit_DsdDecompose( pTruth, nVarsInit );
    pObj = Kit_DsdNonDsdPrimeMax( pNtk );
    if ( pObj == NULL || pObj->nFans == 3 )
    {
        s_pRMan->nTtDsd++;
        Kit_DsdNtkFree( pNtk );
        return;
    }
    nVars = pObj->nFans;
    s_pRMan->nVarFuncs[nVars]++;
    if ( nVars < nVarsInit )
        s_pRMan->nTtDsdPart++;
    else
        s_pRMan->nTtDsdNot++;
    // compute the number of words
    nWords = Abc_TruthWordNum( nVars );
    // copy the function
    memcpy( s_pRMan->pTruthInit, Kit_DsdObjTruth(pObj), (size_t)(4*nWords) );
    Kit_DsdNtkFree( pNtk );
    // canonicize the output
    if ( s_pRMan->pTruthInit[0] & 1 )
        Kit_TruthNot( s_pRMan->pTruthInit, s_pRMan->pTruthInit, nVars );
    memcpy( s_pRMan->pTruth, s_pRMan->pTruthInit, 4*nWords );

    // canonize the function
    for ( i = 0; i < nVars; i++ )
        s_pRMan->pPerm[i] = i;
    uPhaseC = Aig_RManSemiCanonicize( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPerm, s_pRMan->pMints, 1 );
    // check unique variables
    fUniqueVars = Aig_RManVarsAreUnique( s_pRMan->pMints, nVars );
    s_pRMan->nUniqueVars += fUniqueVars;

/*
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    Extra_PrintBinary( stdout, &uPhaseC, nVars );
    printf( "  " );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", s_pRMan->pMints[2*i], s_pRMan->pMints[2*i+1] );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );
*/
/*
    printf( "\n" );
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    printf( "   " );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
//    Aig_RManPrintSigs( s_pRMan->pMints, nVars );
*/

//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );

    if ( Aig_RManTableFindOrAdd( s_pRMan, s_pRMan->pTruth, nVars ) )
        Aig_RManSaveOne( s_pRMan, s_pRMan->pTruth, nVars );

    if ( fVerify )
    {
        // derive reverse permutation
        for ( i = 0; i < nVars; i++ )
            s_pRMan->pPermR[i] = s_pRMan->pPerm[i];
        // implement permutation
        Kit_TruthPermute( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPermR, 1 );
        // implement polarity
        for ( i = 0; i < nVars; i++ )
            if ( uPhaseC & (1 << i) )
                Kit_TruthChangePhase( s_pRMan->pTruth, nVars, i );

        // perform verification
        if ( fUniqueVars && !Kit_TruthIsEqual( s_pRMan->pTruth, s_pRMan->pTruthInit, nVars ) )
            printf( "Verification failed.\n" );
    }
//Aig_RManPrintVarProfile( s_pRMan->pTruth, nVars, s_pRMan->pTruthTemp );
//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n" );
}